

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

void dummy_Object_HasOwnProperty(void)

{
  return;
}

Assistant:

Var JavascriptObject::EntryHasOwn(RecyclableObject* function, CallInfo callInfo, ...)
{
    JIT_HELPER_REENTRANT_HEADER(Object_HasOwn);
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    RecyclableObject* dynamicObject = nullptr;
    // first parameter must exist and be an object coercible or throw type error
    if (args.Info.Count < 2 || FALSE == JavascriptConversion::ToObject(args[1], scriptContext, &dynamicObject))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Object.hasOwn"));
    }

    // if there is only one parameter use undefined as the property to query
    Var propertyName = args.Info.Count == 2 ? scriptContext->GetLibrary()->GetUndefined() : args[2];

    const PropertyRecord* propertyRecord;
    PropertyString* propertyString;
    JavascriptConversion::ToPropertyKey(propertyName, scriptContext, &propertyRecord, &propertyString);

    if (JavascriptOperators::HasOwnProperty(dynamicObject, propertyRecord->GetPropertyId(), scriptContext, propertyString))
    {
        return scriptContext->GetLibrary()->GetTrue();
    }

    return scriptContext->GetLibrary()->GetFalse();
    JIT_HELPER_END(Object_HasOwn);
}